

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

type __thiscall
llvm::yaml::
yamlize<std::vector<llvm::DWARFYAML::FormValue,std::allocator<llvm::DWARFYAML::FormValue>>,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,
          vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_> *Seq,
          bool param_3,EmptyContext *Ctx)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 local_40;
  void *SaveInfo;
  
  uVar3 = (**(code **)(*(long *)this + 0x18))();
  cVar2 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar2 != '\0') {
    uVar3 = (int)((ulong)((long)io->Ctxt - (long)io->_vptr_IO) >> 4) * -0x55555555;
  }
  SaveInfo = io;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      cVar2 = (**(code **)(*(long *)this + 0x20))(this,uVar5 & 0xffffffff,&local_40);
      if (cVar2 != '\0') {
        uVar4 = (*(long *)((long)SaveInfo + 8) - *SaveInfo >> 4) * -0x5555555555555555;
        if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
          std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>::
          resize((vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_> *)
                 SaveInfo,uVar5 + 1);
        }
        lVar1 = *SaveInfo;
        (**(code **)(*(long *)this + 0x68))(this);
        MappingTraits<llvm::DWARFYAML::FormValue>::mapping
                  ((IO *)this,(FormValue *)(uVar5 * 0x30 + lVar1));
        (**(code **)(*(long *)this + 0x70))(this);
        (**(code **)(*(long *)this + 0x28))(this,local_40);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar3);
  }
  (**(code **)(*(long *)this + 0x30))(this);
  return;
}

Assistant:

typename std::enable_if<has_SequenceTraits<T>::value, void>::type
yamlize(IO &io, T &Seq, bool, Context &Ctx) {
  if ( has_FlowTraits< SequenceTraits<T>>::value ) {
    unsigned incnt = io.beginFlowSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightFlowElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightFlowElement(SaveInfo);
      }
    }
    io.endFlowSequence();
  }
  else {
    unsigned incnt = io.beginSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightElement(SaveInfo);
      }
    }
    io.endSequence();
  }
}